

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

string * deqp::gles31::Functional::anon_unknown_1::UserDefinedIOCase::glslTraverseBasicTypes
                   (string *__return_storage_ptr__,string *rootName,VarType *rootType,
                   int arrayNestingDepth,int indentationDepth,BasicTypeVisitFunc visit)

{
  Type TVar1;
  StructType *pSVar2;
  pointer pSVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int arrayNestingDepth_local;
  BasicTypeVisitFunc local_2f0;
  string *local_2e8;
  string indentation;
  string arrayLength;
  string loopIndexName;
  int local_274;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string local_1f0;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  TVar1 = rootType->m_type;
  arrayNestingDepth_local = arrayNestingDepth;
  local_2f0 = visit;
  local_2e8 = rootName;
  if (TVar1 == TYPE_STRUCT) {
    pSVar2 = (rootType->m_data).structPtr;
    uVar4 = ((long)(pSVar2->m_members).
                   super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl
                   .super__Vector_impl_data._M_finish -
            (long)(pSVar2->m_members).
                  super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x38;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    uVar6 = 0;
    uVar5 = uVar4 & 0xffffffff;
    if ((int)uVar4 < 1) {
      uVar5 = uVar6;
    }
    for (; uVar5 * 0x38 - uVar6 != 0; uVar6 = uVar6 + 0x38) {
      pSVar3 = (pSVar2->m_members).
               super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
               super__Vector_impl_data._M_start;
      std::operator+(&arrayLength,local_2e8,".");
      std::operator+(&loopIndexName,&arrayLength,
                     *(char **)((long)&(pSVar3->m_name)._M_dataplus._M_p + uVar6));
      glslTraverseBasicTypes
                (&indentation,&loopIndexName,(VarType *)((long)&(pSVar3->m_type).m_type + uVar6),
                 arrayNestingDepth_local,indentationDepth,local_2f0);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&indentation);
      std::__cxx11::string::~string((string *)&loopIndexName);
      std::__cxx11::string::~string((string *)&arrayLength);
    }
  }
  else if (TVar1 == TYPE_ARRAY) {
    indentation._M_dataplus._M_p = (pointer)&indentation.field_2;
    std::__cxx11::string::_M_construct((ulong)&indentation,(char)indentationDepth);
    de::toString<int>(&arrayLength,&arrayNestingDepth_local);
    std::operator+(&loopIndexName,"i",&arrayLength);
    std::__cxx11::string::~string((string *)&arrayLength);
    local_270._M_dataplus._M_p._0_4_ = (rootType->m_data).array.size;
    de::toString<int>(&arrayLength,(int *)&local_270);
    std::operator+(&local_1b0,&indentation,"for (int ");
    std::operator+(&local_190,&local_1b0,&loopIndexName);
    std::operator+(&local_170,&local_190," = 0; ");
    std::operator+(&local_150,&local_170,&loopIndexName);
    std::operator+(&local_130,&local_150," < ");
    local_274 = (rootType->m_data).array.size;
    de::toString<int>(&local_1d0,&local_274);
    std::operator+(&local_110,&local_130,&local_1d0);
    std::operator+(&local_f0,&local_110,"; ");
    std::operator+(&local_d0,&local_f0,&loopIndexName);
    std::operator+(&local_b0,&local_d0,"++)\n");
    std::operator+(&local_90,&local_b0,&indentation);
    std::operator+(&local_70,&local_90,"{\n");
    std::operator+(&local_250,local_2e8,"[");
    std::operator+(&local_230,&local_250,&loopIndexName);
    std::operator+(&local_210,&local_230,"]");
    glslTraverseBasicTypes
              (&local_1f0,&local_210,(rootType->m_data).array.elementType,
               arrayNestingDepth_local + 1,indentationDepth + 1,local_2f0);
    std::operator+(&local_50,&local_70,&local_1f0);
    std::operator+(&local_270,&local_50,&indentation);
    std::operator+(__return_storage_ptr__,&local_270,"}\n");
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&arrayLength);
    std::__cxx11::string::~string((string *)&loopIndexName);
    std::__cxx11::string::~string((string *)&indentation);
  }
  else if (TVar1 == TYPE_BASIC) {
    (*visit)(__return_storage_ptr__,rootName,(rootType->m_data).basic.type,indentationDepth);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,(char *)0x0,(allocator<char> *)&indentation);
  }
  return __return_storage_ptr__;
}

Assistant:

string UserDefinedIOCase::glslTraverseBasicTypes (const string&			rootName,
												  const glu::VarType&	rootType,
												  int					arrayNestingDepth,
												  int					indentationDepth,
												  BasicTypeVisitFunc	visit)
{
	if (rootType.isBasicType())
		return visit(rootName, rootType.getBasicType(), indentationDepth);
	else if (rootType.isArrayType())
	{
		const string indentation	= string(indentationDepth, '\t');
		const string loopIndexName	= "i" + de::toString(arrayNestingDepth);
		const string arrayLength	= de::toString(rootType.getArraySize());
		return indentation + "for (int " + loopIndexName + " = 0; " + loopIndexName + " < " + de::toString(rootType.getArraySize()) + "; " + loopIndexName + "++)\n" +
			   indentation + "{\n" +
			   glslTraverseBasicTypes(rootName + "[" + loopIndexName + "]", rootType.getElementType(), arrayNestingDepth+1, indentationDepth+1, visit) +
			   indentation + "}\n";
	}
	else if (rootType.isStructType())
	{
		const glu::StructType&	structType = *rootType.getStructPtr();
		const int				numMembers = structType.getNumMembers();
		string					result;

		for (int membNdx = 0; membNdx < numMembers; membNdx++)
		{
			const glu::StructMember& member = structType.getMember(membNdx);
			result += glslTraverseBasicTypes(rootName + "." + member.getName(), member.getType(), arrayNestingDepth, indentationDepth, visit);
		}

		return result;
	}
	else
	{
		DE_ASSERT(false);
		return DE_NULL;
	}
}